

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O2

uint32 __thiscall MTRand::twist(MTRand *this,uint32 *m,uint32 *s0,uint32 *s1)

{
  return (ulong)(-((uint)*s1 & 1) & 0x9908b0df) ^
         (ulong)(((uint)*s1 & 0x7ffffffe | (uint)*s0 & 0x80000000) >> 1) ^ *m;
}

Assistant:

uint32 twist(const uint32 &m, const uint32 &s0, const uint32 &s1) const {
    return m ^ (mixBits(s0, s1) >> 1) ^
           (-static_cast<long>(loBit(s1)) & 0x9908b0dfUL);
  }